

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

SharedExNdPtr __thiscall
front::syntax::SyntaxAnalyze::computeIndex(SyntaxAnalyze *this,SharedSyPtr *arr,SharedExNdPtr *node)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  size_type sVar4;
  element_type *peVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  SharedExNdPtr SVar8;
  SharedExNdPtr byteIndex;
  SharedExNdPtr index2;
  SharedExNdPtr addNode;
  SharedExNdPtr mulNode;
  SharedExNdPtr d;
  size_t i;
  SharedExNdPtr index;
  RightVal rightvalue2;
  RightVal rightvalue1;
  string tmpOff;
  string tmpPtr;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  *dimesions;
  SharedExNdPtr *addr;
  ExpressNode *in_stack_fffffffffffffa48;
  ExpressNode *in_stack_fffffffffffffa50;
  shared_ptr<front::symbol::Symbol> *in_stack_fffffffffffffa58;
  ExpressNode *in_stack_fffffffffffffa70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa78;
  string *this_00;
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffa80;
  string *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa98;
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffaa0;
  TyKind in_stack_fffffffffffffbd4;
  undefined7 in_stack_fffffffffffffbd8;
  undefined1 in_stack_fffffffffffffbdf;
  undefined4 in_stack_fffffffffffffbe0;
  Op in_stack_fffffffffffffbe4;
  RightVal *in_stack_fffffffffffffbe8;
  irGenerator *in_stack_fffffffffffffbf0;
  LeftVal *in_stack_fffffffffffffbf8;
  irGenerator *in_stack_fffffffffffffc00;
  string local_380 [39];
  undefined1 local_359;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358 [4];
  string local_2d0 [200];
  string local_208 [184];
  string local_150 [112];
  ulong local_e0;
  string local_78 [32];
  string local_58 [48];
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  *local_28;
  
  std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
            (in_stack_fffffffffffffa58);
  peVar3 = std::
           __shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2aa86f);
  std::shared_ptr<front::symbol::ArraySymbol>::~shared_ptr
            ((shared_ptr<front::symbol::ArraySymbol> *)0x2aa888);
  local_28 = &peVar3->_dimensions;
  std::__cxx11::string::string(local_58);
  std::__cxx11::string::string(local_78);
  std::
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x2aa8bf);
  std::
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x2aa8cc);
  std::__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x2aa8d9);
  std::
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ::front((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
           *)in_stack_fffffffffffffa50);
  std::shared_ptr<front::express::ExpressNode>::shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffa50,
             (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffa48);
  for (local_e0 = 1; uVar6 = local_e0,
      sVar4 = std::
              vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
              ::size(local_28), uVar6 < sVar4; local_e0 = local_e0 + 1) {
    std::
    vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
    ::at((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
          *)in_stack_fffffffffffffa50,(size_type)in_stack_fffffffffffffa48);
    std::shared_ptr<front::express::ExpressNode>::shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffa50,
               (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffa48);
    operator_new(0x48);
    express::ExpressNode::ExpressNode(in_stack_fffffffffffffa70);
    std::shared_ptr<front::express::ExpressNode>::shared_ptr<front::express::ExpressNode,void>
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffa50,
               in_stack_fffffffffffffa48);
    operator_new(0x48);
    express::ExpressNode::ExpressNode(in_stack_fffffffffffffa70);
    std::shared_ptr<front::express::ExpressNode>::shared_ptr<front::express::ExpressNode,void>
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffa50,
               in_stack_fffffffffffffa48);
    operator_new(0x48);
    express::ExpressNode::ExpressNode(in_stack_fffffffffffffa70);
    std::shared_ptr<front::express::ExpressNode>::shared_ptr<front::express::ExpressNode,void>
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffa50,
               in_stack_fffffffffffffa48);
    uVar6 = local_e0;
    peVar5 = std::
             __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2aaa31);
    sVar4 = std::
            vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
            ::size(&peVar5->_children);
    if (uVar6 < sVar4) {
      std::
      __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2aaa5e);
      std::
      vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
      ::at((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
            *)in_stack_fffffffffffffa50,(size_type)in_stack_fffffffffffffa48);
      std::shared_ptr<front::express::ExpressNode>::operator=
                ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffa50,
                 (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffa48);
    }
    else {
      peVar5 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2aaba1);
      peVar5->_type = CNS;
      peVar5 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2aabb4);
      peVar5->_operation = NUMBER;
      peVar5 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2aabc8);
      peVar5->_value = 0;
    }
    peVar5 = std::
             __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2aabdc);
    peVar5->_operation = MUL;
    peVar5 = std::
             __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2aabf0);
    if ((peVar5->_type == CNS) &&
       (peVar5 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2aac02), peVar5->_type == CNS)) {
      peVar5 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2aac14);
      peVar5->_type = CNS;
      peVar5 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2aac27);
      iVar1 = peVar5->_value;
      peVar5 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2aac3e);
      iVar2 = peVar5->_value;
      peVar5 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2aac60);
      peVar5->_value = iVar1 * iVar2;
    }
    else {
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) != 0) {
        irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
                  ((irGenerator *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                   in_stack_fffffffffffffbd4);
        std::__cxx11::string::operator=(local_78,local_150);
        std::__cxx11::string::~string(local_150);
      }
      peVar5 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2aacd6);
      peVar5->_type = VAR;
      peVar5 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2aace9);
      std::__cxx11::string::operator=((string *)&peVar5->_name,local_78);
      peVar5 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2aad0c);
      if (peVar5->_type == CNS) {
        std::
        __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2aad1e);
        std::variant<int,int,std::__cxx11::string>::emplace<0ul,int&>
                  ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffa50,(int *)in_stack_fffffffffffffa48);
      }
      else {
        std::
        __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2aad43);
        std::variant<int,int,std::__cxx11::string>::emplace<2ul,std::__cxx11::string&>
                  (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
      }
      peVar5 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2aad68);
      if (peVar5->_type == CNS) {
        std::
        __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2aad7a);
        std::variant<int,int,std::__cxx11::string>::emplace<0ul,int&>
                  ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffa50,(int *)in_stack_fffffffffffffa48);
      }
      else {
        std::
        __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2aad9f);
        std::variant<int,int,std::__cxx11::string>::operator=
                  (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
      }
      std::variant<int,std::__cxx11::string>::
      variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffa50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa48);
      std::
      variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffa50,
                (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffa48);
      std::
      variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffa50,
                (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffa48);
      irGenerator::irGenerator::ir_op
                (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                 (RightVal *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                 in_stack_fffffffffffffbe4);
      std::
      variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x2aae4a);
      std::
      variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x2aae57);
      std::
      variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x2aae64);
    }
    std::__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2aaedf);
    std::shared_ptr<front::express::ExpressNode>::shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffa50,
               (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffa48);
    express::ExpressNode::addChild
              (in_stack_fffffffffffffa50,(SharedExNdPtr *)in_stack_fffffffffffffa48);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2aaf28);
    std::__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2aaf35);
    std::shared_ptr<front::express::ExpressNode>::shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffa50,
               (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffa48);
    express::ExpressNode::addChild
              (in_stack_fffffffffffffa50,(SharedExNdPtr *)in_stack_fffffffffffffa48);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2aaf7e);
    peVar5 = std::
             __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2aaf8b);
    peVar5->_operation = PLUS;
    peVar5 = std::
             __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2aaf9f);
    if ((peVar5->_type == CNS) &&
       (peVar5 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2aafb5), peVar5->_type == CNS)) {
      peVar5 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2aafcb);
      peVar5->_type = CNS;
      peVar5 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2aafde);
      iVar1 = peVar5->_value;
      peVar5 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2aaff5);
      iVar2 = peVar5->_value;
      peVar5 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2ab016);
      peVar5->_value = iVar1 + iVar2;
    }
    else {
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) != 0) {
        irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
                  ((irGenerator *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                   in_stack_fffffffffffffbd4);
        std::__cxx11::string::operator=(local_78,local_208);
        std::__cxx11::string::~string(local_208);
      }
      peVar5 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2ab0d8);
      peVar5->_type = VAR;
      peVar5 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2ab0eb);
      std::__cxx11::string::operator=((string *)&peVar5->_name,local_78);
      peVar5 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2ab10e);
      if (peVar5->_type == CNS) {
        std::
        __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2ab120);
        std::variant<int,int,std::__cxx11::string>::emplace<0ul,int&>
                  ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffa50,(int *)in_stack_fffffffffffffa48);
      }
      else {
        std::
        __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2ab145);
        std::variant<int,int,std::__cxx11::string>::emplace<2ul,std::__cxx11::string&>
                  (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
      }
      peVar5 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2ab16a);
      if (peVar5->_type == CNS) {
        std::
        __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2ab17c);
        std::variant<int,int,std::__cxx11::string>::emplace<0ul,int&>
                  ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffa50,(int *)in_stack_fffffffffffffa48);
      }
      else {
        std::
        __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2ab1a1);
        std::variant<int,int,std::__cxx11::string>::operator=
                  (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
      }
      std::variant<int,std::__cxx11::string>::
      variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffa50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa48);
      std::
      variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffa50,
                (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffa48);
      std::
      variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffa50,
                (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffa48);
      irGenerator::irGenerator::ir_op
                (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                 (RightVal *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                 in_stack_fffffffffffffbe4);
      std::
      variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x2ab249);
      std::
      variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x2ab256);
      std::
      variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x2ab263);
    }
    std::__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2ab2de);
    std::shared_ptr<front::express::ExpressNode>::shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffa50,
               (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffa48);
    express::ExpressNode::addChild
              (in_stack_fffffffffffffa50,(SharedExNdPtr *)in_stack_fffffffffffffa48);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2ab327);
    std::__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2ab334);
    std::shared_ptr<front::express::ExpressNode>::shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffa50,
               (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffa48);
    express::ExpressNode::addChild
              (in_stack_fffffffffffffa50,(SharedExNdPtr *)in_stack_fffffffffffffa48);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2ab377);
    std::shared_ptr<front::express::ExpressNode>::operator=
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffa50,
               (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffa48);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2ab399);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2ab3a6);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2ab3b3);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2ab3c0);
  }
  operator_new(0x48);
  express::ExpressNode::ExpressNode(in_stack_fffffffffffffa70);
  std::shared_ptr<front::express::ExpressNode>::shared_ptr<front::express::ExpressNode,void>
            ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffa50,
             in_stack_fffffffffffffa48);
  peVar5 = std::
           __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2ab494);
  peVar5->_operation = MUL;
  peVar5 = std::
           __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2ab4a8);
  if (peVar5->_type == CNS) {
    peVar5 = std::
             __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2ab4ba);
    peVar5->_type = CNS;
    peVar5 = std::
             __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2ab4cd);
    iVar1 = peVar5->_value;
    peVar5 = std::
             __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2ab4e4);
    peVar5->_value = iVar1 << 2;
  }
  else {
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) != 0) {
      irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
                ((irGenerator *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                 in_stack_fffffffffffffbd4);
      std::__cxx11::string::operator=(local_78,local_2d0);
      std::__cxx11::string::~string(local_2d0);
    }
    peVar5 = std::
             __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2ab597);
    peVar5->_type = VAR;
    peVar5 = std::
             __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2ab5a7);
    std::__cxx11::string::operator=((string *)&peVar5->_name,local_78);
    std::__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2ab5ca);
    std::variant<int,int,std::__cxx11::string>::operator=
              (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
    std::variant<int,int,std::__cxx11::string>::emplace<0ul,int_const&>
              ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffa50,(int *)in_stack_fffffffffffffa48);
    in_stack_fffffffffffffaa0 =
         (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)(in_RSI + 0x80);
    std::variant<int,std::__cxx11::string>::
    variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
              ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffa50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa48);
    std::
    variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffa50,
              (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffa48);
    std::
    variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffa50,
              (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffa48);
    irGenerator::irGenerator::ir_op
              (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
               (RightVal *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
               in_stack_fffffffffffffbe4);
    std::
    variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x2ab683);
    std::
    variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x2ab690);
    std::
    variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x2ab69d);
  }
  std::__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x2ab718);
  pbVar7 = local_358;
  std::shared_ptr<front::express::ExpressNode>::shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffa50,
             (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffa48);
  express::ExpressNode::addChild
            (in_stack_fffffffffffffa50,(SharedExNdPtr *)in_stack_fffffffffffffa48);
  std::shared_ptr<front::express::ExpressNode>::~shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2ab755);
  std::shared_ptr<front::express::ExpressNode>::operator=
            ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffa50,
             (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffa48);
  local_359 = 0;
  operator_new(0x48);
  express::ExpressNode::ExpressNode(in_stack_fffffffffffffa70);
  std::shared_ptr<front::express::ExpressNode>::shared_ptr<front::express::ExpressNode,void>
            ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffa50,
             in_stack_fffffffffffffa48);
  irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
            ((irGenerator *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
             in_stack_fffffffffffffbd4);
  this_01 = local_58;
  this_00 = local_380;
  std::__cxx11::string::operator=(this_01,this_00);
  std::__cxx11::string::~string(this_00);
  peVar5 = std::
           __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2ab7f9);
  peVar5->_type = VAR;
  peVar5 = std::
           __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2ab80c);
  peVar5->_operation = PTR;
  peVar5 = std::
           __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2ab820);
  std::__cxx11::string::operator=((string *)&peVar5->_name,this_01);
  std::__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x2ab840);
  std::shared_ptr<front::express::ExpressNode>::shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffa50,
             (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffa48);
  express::ExpressNode::addChild
            (in_stack_fffffffffffffa50,(SharedExNdPtr *)in_stack_fffffffffffffa48);
  std::shared_ptr<front::express::ExpressNode>::~shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2ab87d);
  std::__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x2ab88a);
  std::shared_ptr<front::express::ExpressNode>::shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffa50,
             (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffa48);
  express::ExpressNode::addChild
            (in_stack_fffffffffffffa50,(SharedExNdPtr *)in_stack_fffffffffffffa48);
  std::shared_ptr<front::express::ExpressNode>::~shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2ab8c7);
  peVar5 = std::
           __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2ab8d4);
  if (peVar5->_operation == ARR) {
    in_stack_fffffffffffffa50 = (ExpressNode *)(in_RSI + 0x80);
    std::variant<int,std::__cxx11::string>::
    variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
              ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffa50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa48);
    std::__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2ab913);
    std::variant<int,std::__cxx11::string>::
    variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
              ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffa50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa48);
    irGenerator::irGenerator::ir_ref
              (in_stack_fffffffffffffbf0,(LeftVal *)in_stack_fffffffffffffbe8,
               (LeftVal *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
               (bool)in_stack_fffffffffffffbdf);
    std::
    variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x2ab954);
    std::
    variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x2ab961);
    std::variant<int,int,std::__cxx11::string>::operator=(in_stack_fffffffffffffaa0,pbVar7);
  }
  else {
    std::__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2aba86);
    std::variant<int,int,std::__cxx11::string>::operator=(in_stack_fffffffffffffaa0,pbVar7);
  }
  peVar5 = std::
           __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2abaab);
  if (peVar5->_type == CNS) {
    std::__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2ababd);
    std::variant<int,int,std::__cxx11::string>::emplace<0ul,int&>
              ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffa50,(int *)in_stack_fffffffffffffa48);
  }
  else {
    std::__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2abae2);
    std::variant<int,int,std::__cxx11::string>::operator=(in_stack_fffffffffffffaa0,pbVar7);
  }
  pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x80);
  std::variant<int,std::__cxx11::string>::
  variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
            ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffa50,pbVar7);
  std::
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffffa50,
            (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pbVar7);
  std::
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffffa50,
            (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pbVar7);
  irGenerator::irGenerator::ir_op
            (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
             (RightVal *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
             in_stack_fffffffffffffbe4);
  std::
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x2abb82);
  std::
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x2abb8f);
  std::
  variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x2abb9c);
  local_359 = 1;
  std::shared_ptr<front::express::ExpressNode>::~shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2abc33);
  std::shared_ptr<front::express::ExpressNode>::~shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2abc40);
  std::
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x2abc4d);
  std::
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x2abc5a);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  SVar8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  SVar8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (SharedExNdPtr)
         SVar8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedExNdPtr SyntaxAnalyze::computeIndex(SharedSyPtr arr, SharedExNdPtr node) {
  vector<SharedExNdPtr> &dimesions =
      std::static_pointer_cast<ArraySymbol>(arr)->_dimensions;
  string tmpPtr;
  string tmpOff;
  RightVal rightvalue1;
  RightVal rightvalue2;
  SharedExNdPtr index = node->_children.front();
  size_t i;

  // in function, there should be a virtual d in dimensions.at(0)
  for (i = 1; i < dimesions.size(); i++) {
    SharedExNdPtr d = dimesions.at(i);

    SharedExNdPtr mulNode = SharedExNdPtr(new ExpressNode());
    SharedExNdPtr addNode = SharedExNdPtr(new ExpressNode());
    SharedExNdPtr index2 = SharedExNdPtr(new ExpressNode());

    if (i < node->_children.size()) {
      index2 = node->_children.at(i);
    } else {
      index2->_type = NodeType::CNS;
      index2->_operation = OperationType::NUMBER;
      index2->_value = 0;
    }

    mulNode->_operation = OperationType::MUL;
    if (index->_type == NodeType::CNS && d->_type == NodeType::CNS) {
      mulNode->_type = NodeType::CNS;
      mulNode->_value = index->_value * d->_value;
    } else {
      if (tmpOff.empty()) {
        tmpOff = irGenerator.getNewTmpValueName(TyKind::Int);
      }

      mulNode->_type = NodeType::VAR;
      mulNode->_name = tmpOff;
      if (index->_type == NodeType::CNS) {
        rightvalue1.emplace<0>(index->_value);
      } else {
        rightvalue1.emplace<2>(index->_name);
      }
      if (d->_type == NodeType::CNS) {
        rightvalue2.emplace<0>(d->_value);
      } else {
        rightvalue2 = d->_name;
      }
      irGenerator.ir_op(tmpOff, rightvalue1, rightvalue2, Op::Mul);
    }
    mulNode->addChild(index);
    mulNode->addChild(d);

    addNode->_operation = OperationType::PLUS;
    if (mulNode->_type == NodeType::CNS && index2->_type == NodeType::CNS) {
      addNode->_type = NodeType::CNS;
      addNode->_value = mulNode->_value + index2->_value;
    } else {
      if (tmpOff.empty()) {
        tmpOff = irGenerator.getNewTmpValueName(TyKind::Int);
      }

      addNode->_type = NodeType::VAR;
      addNode->_name = tmpOff;
      if (mulNode->_type == NodeType::CNS) {
        rightvalue1.emplace<0>(mulNode->_value);
      } else {
        rightvalue1.emplace<2>(mulNode->_name);
      }
      if (index2->_type == NodeType::CNS) {
        rightvalue2.emplace<0>(index2->_value);
      } else {
        rightvalue2 = index2->_name;
      }
      irGenerator.ir_op(tmpOff, rightvalue1, rightvalue2, Op::Add);
    }
    addNode->addChild(mulNode);
    addNode->addChild(index2);

    index = addNode;
  }

  SharedExNdPtr byteIndex = SharedExNdPtr(new ExpressNode());
  byteIndex->_operation = OperationType::MUL;
  if (index->_type == NodeType::CNS) {
    byteIndex->_type = NodeType::CNS;
    byteIndex->_value = index->_value * mir::types::INT_SIZE;
  } else {
    if (tmpOff.empty()) {
      tmpOff = irGenerator.getNewTmpValueName(TyKind::Int);
    }

    byteIndex->_type = NodeType::VAR;
    byteIndex->_name = tmpOff;

    rightvalue1 = index->_name;
    rightvalue2.emplace<0>(mir::types::INT_SIZE);

    irGenerator.ir_op(tmpOff, rightvalue1, rightvalue2, Op::Mul);
  }
  byteIndex->addChild(index);
  index = byteIndex;

  SharedExNdPtr addr = SharedExNdPtr(new ExpressNode());
  tmpPtr = irGenerator.getNewTmpValueName(TyKind::Ptr);

  addr->_type = NodeType::VAR;
  addr->_operation = OperationType::PTR;
  addr->_name = tmpPtr;
  addr->addChild(node);
  addr->addChild(index);

  if (node->_operation == OperationType::ARR) {
    irGenerator.ir_ref(tmpPtr, node->_name);
    rightvalue1 = tmpPtr;
  } else {
    rightvalue1 = node->_name;
  }
  if (index->_type == NodeType::CNS) {
    rightvalue2.emplace<0>(index->_value);
  } else {
    rightvalue2 = index->_name;
  }
  irGenerator.ir_op(tmpPtr, rightvalue1, rightvalue2, Op::Add);

  return addr;
}